

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O3

xmlRelaxNGDefinePtr_conflict xmlRelaxNGParsePattern(xmlRelaxNGParserCtxtPtr ctxt,xmlNodePtr node)

{
  uint uVar1;
  xmlRelaxNGGrammarPtr_conflict pxVar2;
  xmlRelaxNGGrammarPtr_conflict pxVar3;
  bool bVar4;
  xmlNode *pxVar5;
  int iVar6;
  xmlRelaxNGDefinePtr_conflict pxVar7;
  xmlRelaxNGDefinePtr_conflict pxVar8;
  xmlRelaxNGDefinePtr pxVar9;
  xmlChar *pxVar10;
  xmlHashTablePtr pxVar11;
  void *pvVar12;
  xmlChar *pxVar13;
  xmlRelaxNGDefinePtr *ppxVar14;
  xmlRelaxNGDefinePtr_conflict pxVar15;
  xmlRelaxNGGrammarPtr_conflict pxVar16;
  uint uVar17;
  char *pcVar18;
  xmlNs *pxVar19;
  xmlRelaxNGDefinePtr_conflict pxVar20;
  _xmlNode *p_Var21;
  xmlNodePtr pxVar22;
  xmlChar *local_50;
  xmlRelaxNGDefinePtr_conflict local_48;
  xmlRelaxNGDefinePtr local_38;
  
  if ((node->ns == (xmlNs *)0x0) || (node->type != XML_ELEMENT_NODE)) {
LAB_00175133:
    pxVar10 = node->name;
    pcVar18 = "Unexpected node %s is not a pattern\n";
    pxVar7 = (xmlRelaxNGDefinePtr_conflict)0x0;
    iVar6 = 0x45b;
  }
  else {
    iVar6 = xmlStrEqual(node->name,"element");
    pxVar19 = node->ns;
    if (iVar6 != 0) {
      iVar6 = xmlStrEqual(pxVar19->href,(xmlChar *)"http://relaxng.org/ns/structure/1.0");
      if (iVar6 != 0) {
        pxVar7 = xmlRelaxNGParseElement(ctxt,node);
        return pxVar7;
      }
      pxVar19 = node->ns;
    }
    if ((pxVar19 == (xmlNs *)0x0) || (node->type != XML_ELEMENT_NODE)) goto LAB_00175133;
    iVar6 = xmlStrEqual(node->name,"attribute");
    pxVar19 = node->ns;
    if (iVar6 == 0) {
LAB_001741c7:
      if ((pxVar19 != (xmlNs *)0x0) && (node->type == XML_ELEMENT_NODE)) {
        iVar6 = xmlStrEqual(node->name,"empty");
        pxVar19 = node->ns;
        if (iVar6 != 0) {
          iVar6 = xmlStrEqual(pxVar19->href,(xmlChar *)"http://relaxng.org/ns/structure/1.0");
          if (iVar6 != 0) {
            pxVar7 = xmlRelaxNGNewDefine(ctxt,node);
            if (pxVar7 == (xmlRelaxNGDefinePtr_conflict)0x0) {
              return (xmlRelaxNGDefinePtr_conflict)0x0;
            }
            pxVar7->type = XML_RELAXNG_EMPTY;
            if (node->children == (_xmlNode *)0x0) {
              return pxVar7;
            }
            pcVar18 = "empty: had a child node\n";
            iVar6 = 0x401;
            goto LAB_00174255;
          }
          pxVar19 = node->ns;
        }
        if ((pxVar19 != (xmlNs *)0x0) && (node->type == XML_ELEMENT_NODE)) {
          iVar6 = xmlStrEqual(node->name,"text");
          pxVar19 = node->ns;
          if (iVar6 != 0) {
            iVar6 = xmlStrEqual(pxVar19->href,(xmlChar *)"http://relaxng.org/ns/structure/1.0");
            if (iVar6 != 0) {
              pxVar7 = xmlRelaxNGNewDefine(ctxt,node);
              if (pxVar7 == (xmlRelaxNGDefinePtr_conflict)0x0) {
                return (xmlRelaxNGDefinePtr_conflict)0x0;
              }
              pxVar7->type = XML_RELAXNG_TEXT;
              if (node->children == (_xmlNode *)0x0) {
                return pxVar7;
              }
              pcVar18 = "text: had a child node\n";
              iVar6 = 0x455;
              goto LAB_00174255;
            }
            pxVar19 = node->ns;
          }
          if ((pxVar19 != (xmlNs *)0x0) && (node->type == XML_ELEMENT_NODE)) {
            iVar6 = xmlStrEqual(node->name,(xmlChar *)"zeroOrMore");
            pxVar19 = node->ns;
            if (iVar6 != 0) {
              iVar6 = xmlStrEqual(pxVar19->href,(xmlChar *)"http://relaxng.org/ns/structure/1.0");
              if (iVar6 == 0) {
                pxVar19 = node->ns;
                goto LAB_001743af;
              }
              pxVar7 = xmlRelaxNGNewDefine(ctxt,node);
              if (pxVar7 == (xmlRelaxNGDefinePtr_conflict)0x0) {
                return (xmlRelaxNGDefinePtr_conflict)0x0;
              }
              pxVar7->type = XML_RELAXNG_ZEROORMORE;
LAB_00174366:
              p_Var21 = node->children;
              if (p_Var21 != (_xmlNode *)0x0) {
                iVar6 = 1;
LAB_0017437b:
                pxVar9 = xmlRelaxNGParsePatterns(ctxt,p_Var21,iVar6);
                goto LAB_00174380;
              }
LAB_001744eb:
              pxVar10 = node->name;
              pcVar18 = "Element %s is empty\n";
              iVar6 = 0x3ff;
              goto LAB_0017514c;
            }
LAB_001743af:
            if ((pxVar19 != (xmlNs *)0x0) && (node->type == XML_ELEMENT_NODE)) {
              iVar6 = xmlStrEqual(node->name,(xmlChar *)"oneOrMore");
              pxVar19 = node->ns;
              if (iVar6 != 0) {
                iVar6 = xmlStrEqual(pxVar19->href,(xmlChar *)"http://relaxng.org/ns/structure/1.0");
                if (iVar6 != 0) {
                  pxVar7 = xmlRelaxNGNewDefine(ctxt,node);
                  if (pxVar7 == (xmlRelaxNGDefinePtr_conflict)0x0) {
                    return (xmlRelaxNGDefinePtr_conflict)0x0;
                  }
                  pxVar7->type = XML_RELAXNG_ONEORMORE;
                  goto LAB_00174366;
                }
                pxVar19 = node->ns;
              }
              if ((pxVar19 != (xmlNs *)0x0) && (node->type == XML_ELEMENT_NODE)) {
                iVar6 = xmlStrEqual(node->name,(xmlChar *)"optional");
                pxVar19 = node->ns;
                if (iVar6 != 0) {
                  iVar6 = xmlStrEqual(pxVar19->href,(xmlChar *)"http://relaxng.org/ns/structure/1.0"
                                     );
                  if (iVar6 != 0) {
                    pxVar7 = xmlRelaxNGNewDefine(ctxt,node);
                    if (pxVar7 == (xmlRelaxNGDefinePtr_conflict)0x0) {
                      return (xmlRelaxNGDefinePtr_conflict)0x0;
                    }
                    pxVar7->type = XML_RELAXNG_OPTIONAL;
                    goto LAB_00174366;
                  }
                  pxVar19 = node->ns;
                }
                if ((pxVar19 != (xmlNs *)0x0) && (node->type == XML_ELEMENT_NODE)) {
                  iVar6 = xmlStrEqual(node->name,(xmlChar *)"choice");
                  pxVar19 = node->ns;
                  if (iVar6 != 0) {
                    iVar6 = xmlStrEqual(pxVar19->href,
                                        (xmlChar *)"http://relaxng.org/ns/structure/1.0");
                    if (iVar6 == 0) {
                      pxVar19 = node->ns;
                      goto LAB_0017450a;
                    }
                    pxVar7 = xmlRelaxNGNewDefine(ctxt,node);
                    if (pxVar7 == (xmlRelaxNGDefinePtr_conflict)0x0) {
                      return (xmlRelaxNGDefinePtr_conflict)0x0;
                    }
                    pxVar7->type = XML_RELAXNG_CHOICE;
LAB_001744d8:
                    p_Var21 = node->children;
                    if (p_Var21 == (_xmlNode *)0x0) goto LAB_001744eb;
                    iVar6 = 0;
                    goto LAB_0017437b;
                  }
LAB_0017450a:
                  if ((pxVar19 != (xmlNs *)0x0) && (node->type == XML_ELEMENT_NODE)) {
                    iVar6 = xmlStrEqual(node->name,"group");
                    pxVar19 = node->ns;
                    if (iVar6 != 0) {
                      iVar6 = xmlStrEqual(pxVar19->href,
                                          (xmlChar *)"http://relaxng.org/ns/structure/1.0");
                      if (iVar6 != 0) {
                        pxVar7 = xmlRelaxNGNewDefine(ctxt,node);
                        if (pxVar7 == (xmlRelaxNGDefinePtr_conflict)0x0) {
                          return (xmlRelaxNGDefinePtr_conflict)0x0;
                        }
                        pxVar7->type = XML_RELAXNG_GROUP;
                        goto LAB_001744d8;
                      }
                      pxVar19 = node->ns;
                    }
                    if ((pxVar19 != (xmlNs *)0x0) && (node->type == XML_ELEMENT_NODE)) {
                      iVar6 = xmlStrEqual(node->name,"ref");
                      pxVar19 = node->ns;
                      if (iVar6 != 0) {
                        iVar6 = xmlStrEqual(pxVar19->href,
                                            (xmlChar *)"http://relaxng.org/ns/structure/1.0");
                        if (iVar6 == 0) {
                          pxVar19 = node->ns;
                          goto LAB_00174627;
                        }
                        pxVar7 = xmlRelaxNGNewDefine(ctxt,node);
                        if (pxVar7 == (xmlRelaxNGDefinePtr_conflict)0x0) {
                          return (xmlRelaxNGDefinePtr_conflict)0x0;
                        }
                        pxVar7->type = XML_RELAXNG_REF;
                        pxVar10 = xmlGetProp(node,"name");
                        pxVar7->name = pxVar10;
                        if (pxVar10 == (xmlChar *)0x0) {
                          pcVar18 = "ref has no name\n";
                          iVar6 = 0x44e;
                          pxVar10 = (xmlChar *)0x0;
LAB_001747ac:
                          xmlRngPErr(ctxt,node,iVar6,pcVar18,pxVar10,(xmlChar *)0x0);
                        }
                        else {
                          xmlRelaxNGNormExtSpace(pxVar10);
                          iVar6 = xmlValidateNCName(pxVar7->name,0);
                          if (iVar6 != 0) {
                            pxVar10 = pxVar7->name;
                            pcVar18 = "ref name \'%s\' is not an NCName\n";
                            iVar6 = 0x44c;
                            goto LAB_001747ac;
                          }
                        }
                        if (node->children != (_xmlNode *)0x0) {
                          xmlRngPErr(ctxt,node,0x44f,"ref is not empty\n",(xmlChar *)0x0,
                                     (xmlChar *)0x0);
                        }
                        pxVar11 = ctxt->grammar->refs;
                        if (pxVar11 == (xmlHashTablePtr)0x0) {
                          pxVar11 = xmlHashCreate(10);
                          ctxt->grammar->refs = pxVar11;
                          if (pxVar11 != (xmlHashTablePtr)0x0) goto LAB_00174803;
                          pcVar18 = "Could not create references hash\n";
LAB_001749ee:
                          pxVar7 = (xmlRelaxNGDefinePtr_conflict)0x0;
                          iVar6 = 0x44a;
                          goto LAB_00174255;
                        }
LAB_00174803:
                        iVar6 = xmlHashAddEntry(pxVar11,pxVar7->name,pxVar7);
                        if (-1 < iVar6) {
                          return pxVar7;
                        }
                        pvVar12 = xmlHashLookup(ctxt->grammar->refs,pxVar7->name);
                        if (pvVar12 != (void *)0x0) goto LAB_00174831;
                        pxVar10 = pxVar7->name;
                        if (pxVar10 == (xmlChar *)0x0) {
                          pcVar18 = "Error refs definitions\n";
                          goto LAB_001749ee;
                        }
                        pcVar18 = "Error refs definitions \'%s\'\n";
                        pxVar7 = (xmlRelaxNGDefinePtr_conflict)0x0;
                        iVar6 = 0x44a;
                        goto LAB_0017514c;
                      }
LAB_00174627:
                      if ((pxVar19 != (xmlNs *)0x0) && (node->type == XML_ELEMENT_NODE)) {
                        iVar6 = xmlStrEqual(node->name,"data");
                        pxVar19 = node->ns;
                        if (iVar6 != 0) {
                          iVar6 = xmlStrEqual(pxVar19->href,
                                              (xmlChar *)"http://relaxng.org/ns/structure/1.0");
                          if (iVar6 != 0) {
                            pxVar10 = xmlGetProp(node,"type");
                            if (pxVar10 == (xmlChar *)0x0) {
                              pcVar18 = "data has no type\n";
                              pxVar7 = (xmlRelaxNGDefinePtr_conflict)0x0;
                              iVar6 = 0x456;
                              goto LAB_00174255;
                            }
                            xmlRelaxNGNormExtSpace(pxVar10);
                            pxVar22 = (xmlNodePtr)0x0;
                            iVar6 = xmlValidateNCName(pxVar10,0);
                            if (iVar6 != 0) {
                              pxVar22 = node;
                              xmlRngPErr(ctxt,node,0x458,"data type \'%s\' is not an NCName\n",
                                         pxVar10,(xmlChar *)0x0);
                            }
                            local_50 = xmlRelaxNGGetDataTypeLibrary
                                                 ((xmlRelaxNGParserCtxtPtr)node,pxVar22);
                            if (local_50 == (xmlChar *)0x0) {
                              local_50 = xmlStrdup((xmlChar *)"http://relaxng.org/ns/structure/1.0")
                              ;
                            }
                            pxVar7 = xmlRelaxNGNewDefine(ctxt,node);
                            if (pxVar7 == (xmlRelaxNGDefinePtr_conflict)0x0) {
                              (*xmlFree)(local_50);
                              (*xmlFree)(pxVar10);
                              return (xmlRelaxNGDefinePtr_conflict)0x0;
                            }
                            pxVar7->type = XML_RELAXNG_DATATYPE;
                            pxVar7->name = pxVar10;
                            pxVar7->ns = local_50;
                            pvVar12 = xmlHashLookup(xmlRelaxNGRegisteredTypes,local_50);
                            if (pvVar12 == (void *)0x0) {
                              xmlRngPErr(ctxt,node,0x45c,"Use of unregistered type library \'%s\'\n"
                                         ,local_50,(xmlChar *)0x0);
                              pxVar7->data = (void *)0x0;
                            }
                            else {
                              pxVar7->data = pvVar12;
                              if (*(code **)((long)pvVar12 + 0x10) == (code *)0x0) {
                                pcVar18 = "Internal error with type library \'%s\': no \'have\'\n";
                                iVar6 = 0x402;
                                pxVar13 = (xmlChar *)0x0;
                                pxVar10 = local_50;
                              }
                              else {
                                iVar6 = (**(code **)((long)pvVar12 + 0x10))
                                                  (*(undefined8 *)((long)pvVar12 + 8),pxVar7->name);
                                if (iVar6 == 1) {
                                  iVar6 = xmlStrEqual(local_50,(xmlChar *)
                                                                                                                              
                                                  "http://www.w3.org/2001/XMLSchema-datatypes");
                                  if ((iVar6 != 0) &&
                                     ((iVar6 = xmlStrEqual(pxVar7->name,"IDREF"), iVar6 != 0 ||
                                      (iVar6 = xmlStrEqual(pxVar7->name,"IDREFS"), iVar6 != 0)))) {
                                    ctxt->idref = 1;
                                  }
                                  goto LAB_00174ad7;
                                }
                                pcVar18 = 
                                "Error type \'%s\' is not exported by type library \'%s\'\n";
                                iVar6 = 0x457;
                                pxVar10 = pxVar7->name;
                                pxVar13 = local_50;
                              }
                              xmlRngPErr(ctxt,node,iVar6,pcVar18,pxVar10,pxVar13);
                            }
LAB_00174ad7:
                            p_Var21 = node->children;
                            if (p_Var21 == (_xmlNode *)0x0) {
                              return pxVar7;
                            }
                            local_48 = (xmlRelaxNGDefinePtr_conflict)0x0;
                            while (iVar6 = xmlStrEqual(p_Var21->name,(xmlChar *)"param"), iVar6 != 0
                                  ) {
                              iVar6 = xmlStrEqual(local_50,(xmlChar *)
                                                           "http://relaxng.org/ns/structure/1.0");
                              if (iVar6 == 0) {
                                pxVar8 = xmlRelaxNGNewDefine(ctxt,node);
                                if (pxVar8 != (xmlRelaxNGDefinePtr_conflict)0x0) {
                                  pxVar8->type = XML_RELAXNG_PARAM;
                                  pxVar10 = xmlGetProp(p_Var21,"name");
                                  pxVar8->name = pxVar10;
                                  if (pxVar10 == (xmlChar *)0x0) {
                                    xmlRngPErr(ctxt,node,0x423,"param has no name\n",(xmlChar *)0x0,
                                               (xmlChar *)0x0);
                                  }
                                  pxVar10 = xmlNodeGetContent(p_Var21);
                                  pxVar8->value = pxVar10;
                                  ppxVar14 = &local_48->next;
                                  if (local_48 == (xmlRelaxNGDefinePtr_conflict)0x0) {
                                    ppxVar14 = &pxVar7->attrs;
                                  }
                                  *ppxVar14 = pxVar8;
                                  local_48 = pxVar8;
                                }
                                p_Var21 = p_Var21->next;
                              }
                              else {
                                xmlRngPErr(ctxt,node,0x422,
                                           "Type library \'%s\' does not allow type parameters\n",
                                           local_50,(xmlChar *)0x0);
                                do {
                                  p_Var21 = p_Var21->next;
                                  if (p_Var21 == (_xmlNode *)0x0) {
                                    return pxVar7;
                                  }
                                  iVar6 = xmlStrEqual(p_Var21->name,(xmlChar *)"param");
                                } while (iVar6 != 0);
                              }
                              if (p_Var21 == (_xmlNode *)0x0) {
                                return pxVar7;
                              }
                            }
                            iVar6 = xmlStrEqual(p_Var21->name,(xmlChar *)"except");
                            pxVar5 = p_Var21;
                            if (iVar6 != 0) {
                              pxVar8 = xmlRelaxNGNewDefine(ctxt,node);
                              if (pxVar8 == (xmlRelaxNGDefinePtr_conflict)0x0) {
                                return pxVar7;
                              }
                              pxVar8->type = XML_RELAXNG_EXCEPT;
                              pxVar22 = p_Var21->children;
                              pxVar7->content = pxVar8;
                              if (pxVar22 == (xmlNodePtr)0x0) {
                                xmlRngPErr(ctxt,p_Var21,0x406,"except has no content\n",
                                           (xmlChar *)0x0,(xmlChar *)0x0);
                              }
                              else {
                                pxVar20 = (xmlRelaxNGDefinePtr_conflict)0x0;
                                do {
                                  pxVar15 = xmlRelaxNGParsePattern(ctxt,pxVar22);
                                  if (pxVar15 != (xmlRelaxNGDefinePtr_conflict)0x0) {
                                    ppxVar14 = &pxVar20->next;
                                    if (pxVar20 == (xmlRelaxNGDefinePtr_conflict)0x0) {
                                      ppxVar14 = &pxVar8->content;
                                    }
                                    *ppxVar14 = pxVar15;
                                    pxVar20 = pxVar15;
                                  }
                                  pxVar22 = pxVar22->next;
                                } while (pxVar22 != (_xmlNode *)0x0);
                              }
                              pxVar5 = p_Var21->next;
                              if (p_Var21->next == (xmlNodePtr)0x0) {
                                return pxVar7;
                              }
                            }
                            node = pxVar5;
                            pxVar10 = node->name;
                            pcVar18 = "Element data has unexpected content %s\n";
                            iVar6 = 0x3f1;
                            goto LAB_0017514c;
                          }
                          pxVar19 = node->ns;
                        }
                        if ((pxVar19 != (xmlNs *)0x0) && (node->type == XML_ELEMENT_NODE)) {
                          iVar6 = xmlStrEqual(node->name,"value");
                          pxVar19 = node->ns;
                          if (iVar6 != 0) {
                            iVar6 = xmlStrEqual(pxVar19->href,
                                                (xmlChar *)"http://relaxng.org/ns/structure/1.0");
                            if (iVar6 != 0) {
                              pxVar7 = xmlRelaxNGNewDefine(ctxt,node);
                              if (pxVar7 == (xmlRelaxNGDefinePtr_conflict)0x0) {
                                return (xmlRelaxNGDefinePtr_conflict)0x0;
                              }
                              pxVar7->type = XML_RELAXNG_VALUE;
                              pxVar10 = xmlGetProp(node,"type");
                              if (pxVar10 == (xmlChar *)0x0) {
                                pvVar12 = (void *)0x0;
LAB_00174c16:
                                bVar4 = false;
                              }
                              else {
                                xmlRelaxNGNormExtSpace(pxVar10);
                                pxVar22 = (xmlNodePtr)0x0;
                                iVar6 = xmlValidateNCName(pxVar10,0);
                                if (iVar6 != 0) {
                                  pxVar22 = node;
                                  xmlRngPErr(ctxt,node,0x458,"value type \'%s\' is not an NCName\n",
                                             pxVar10,(xmlChar *)0x0);
                                }
                                pxVar13 = xmlRelaxNGGetDataTypeLibrary
                                                    ((xmlRelaxNGParserCtxtPtr)node,pxVar22);
                                if (pxVar13 == (xmlChar *)0x0) {
                                  pxVar13 = xmlStrdup((xmlChar *)
                                                      "http://relaxng.org/ns/structure/1.0");
                                }
                                pxVar7->name = pxVar10;
                                pxVar7->ns = pxVar13;
                                pvVar12 = xmlHashLookup(xmlRelaxNGRegisteredTypes,pxVar13);
                                if (pvVar12 == (void *)0x0) {
                                  pvVar12 = (void *)0x0;
                                  xmlRngPErr(ctxt,node,0x45c,
                                             "Use of unregistered type library \'%s\'\n",pxVar13,
                                             (xmlChar *)0x0);
                                  pxVar7->data = (void *)0x0;
                                  goto LAB_00174c16;
                                }
                                pxVar7->data = pvVar12;
                                if (*(code **)((long)pvVar12 + 0x10) == (code *)0x0) {
                                  bVar4 = false;
                                  xmlRngPErr(ctxt,node,0x402,
                                             "Internal error with type library \'%s\': no \'have\'\n"
                                             ,pxVar13,(xmlChar *)0x0);
                                }
                                else {
                                  iVar6 = (**(code **)((long)pvVar12 + 0x10))
                                                    (*(undefined8 *)((long)pvVar12 + 8),pxVar7->name
                                                    );
                                  bVar4 = true;
                                  if (iVar6 != 1) {
                                    xmlRngPErr(ctxt,node,0x457,
                                               "Error type \'%s\' is not exported by type library \'%s\'\n"
                                               ,pxVar7->name,pxVar13);
                                    goto LAB_00174c16;
                                  }
                                }
                              }
                              p_Var21 = node->children;
                              if (p_Var21 == (_xmlNode *)0x0) {
                                pxVar10 = xmlStrdup("");
                                pxVar7->value = pxVar10;
                                return pxVar7;
                              }
                              if ((p_Var21->type - XML_TEXT_NODE < 2) &&
                                 (p_Var21->next == (_xmlNode *)0x0)) {
                                pxVar10 = xmlNodeGetContent(node);
                                pxVar7->value = pxVar10;
                                if (pxVar10 != (xmlChar *)0x0) {
                                  if (pvVar12 == (void *)0x0) {
                                    return pxVar7;
                                  }
                                  if (!bVar4 || *(code **)((long)pvVar12 + 0x18) == (code *)0x0) {
                                    return pxVar7;
                                  }
                                  local_38 = (xmlRelaxNGDefinePtr)0x0;
                                  iVar6 = (**(code **)((long)pvVar12 + 0x18))
                                                    (*(undefined8 *)((long)pvVar12 + 8),pxVar7->name
                                                     ,pxVar10,&local_38,node);
                                  if (iVar6 == 1) {
                                    if (local_38 != (xmlRelaxNGDefinePtr)0x0) {
                                      pxVar7->attrs = local_38;
                                      return pxVar7;
                                    }
                                    return pxVar7;
                                  }
                                  pxVar13 = pxVar7->name;
                                  pxVar10 = pxVar7->value;
                                  pcVar18 = "Value \'%s\' is not acceptable for type \'%s\'\n";
                                  iVar6 = 0x41b;
                                  goto LAB_0017514f;
                                }
                                pcVar18 = "Element <value> has no content\n";
                                iVar6 = 0x460;
                              }
                              else {
                                pcVar18 = "Expecting a single text value for <value>content\n";
                                iVar6 = 0x454;
                              }
                              goto LAB_00174255;
                            }
                            pxVar19 = node->ns;
                          }
                          if ((pxVar19 != (xmlNs *)0x0) && (node->type == XML_ELEMENT_NODE)) {
                            iVar6 = xmlStrEqual(node->name,"list");
                            pxVar19 = node->ns;
                            if (iVar6 != 0) {
                              iVar6 = xmlStrEqual(pxVar19->href,
                                                  (xmlChar *)"http://relaxng.org/ns/structure/1.0");
                              if (iVar6 != 0) {
                                pxVar7 = xmlRelaxNGNewDefine(ctxt,node);
                                if (pxVar7 == (xmlRelaxNGDefinePtr_conflict)0x0) {
                                  return (xmlRelaxNGDefinePtr_conflict)0x0;
                                }
                                pxVar7->type = XML_RELAXNG_LIST;
                                goto LAB_001744d8;
                              }
                              pxVar19 = node->ns;
                            }
                            if ((pxVar19 != (xmlNs *)0x0) && (node->type == XML_ELEMENT_NODE)) {
                              iVar6 = xmlStrEqual(node->name,(xmlChar *)"interleave");
                              pxVar19 = node->ns;
                              if (iVar6 != 0) {
                                iVar6 = xmlStrEqual(pxVar19->href,
                                                    (xmlChar *)"http://relaxng.org/ns/structure/1.0"
                                                   );
                                if (iVar6 != 0) {
                                  pxVar7 = xmlRelaxNGParseInterleave(ctxt,node);
                                  return pxVar7;
                                }
                                pxVar19 = node->ns;
                              }
                              if ((pxVar19 != (xmlNs *)0x0) && (node->type == XML_ELEMENT_NODE)) {
                                iVar6 = xmlStrEqual(node->name,(xmlChar *)"externalRef");
                                pxVar19 = node->ns;
                                if (iVar6 != 0) {
                                  iVar6 = xmlStrEqual(pxVar19->href,
                                                      (xmlChar *)
                                                      "http://relaxng.org/ns/structure/1.0");
                                  if (iVar6 != 0) {
                                    pxVar7 = xmlRelaxNGProcessExternalRef(ctxt,node);
                                    return pxVar7;
                                  }
                                  pxVar19 = node->ns;
                                }
                                if ((pxVar19 != (xmlNs *)0x0) && (node->type == XML_ELEMENT_NODE)) {
                                  iVar6 = xmlStrEqual(node->name,(xmlChar *)"notAllowed");
                                  pxVar19 = node->ns;
                                  if (iVar6 != 0) {
                                    iVar6 = xmlStrEqual(pxVar19->href,
                                                        (xmlChar *)
                                                        "http://relaxng.org/ns/structure/1.0");
                                    if (iVar6 != 0) {
                                      pxVar7 = xmlRelaxNGNewDefine(ctxt,node);
                                      if (pxVar7 == (xmlRelaxNGDefinePtr_conflict)0x0) {
                                        return (xmlRelaxNGDefinePtr_conflict)0x0;
                                      }
                                      pxVar7->type = XML_RELAXNG_NOT_ALLOWED;
                                      if (node->children == (_xmlNode *)0x0) {
                                        return pxVar7;
                                      }
                                      pcVar18 = "xmlRelaxNGParse: notAllowed element is not empty\n"
                                      ;
                                      iVar6 = 0x41f;
                                      goto LAB_00174255;
                                    }
                                    pxVar19 = node->ns;
                                  }
                                  if ((pxVar19 != (xmlNs *)0x0) && (node->type == XML_ELEMENT_NODE))
                                  {
                                    iVar6 = xmlStrEqual(node->name,"grammar");
                                    pxVar19 = node->ns;
                                    if (iVar6 != 0) {
                                      iVar6 = xmlStrEqual(pxVar19->href,
                                                          (xmlChar *)
                                                          "http://relaxng.org/ns/structure/1.0");
                                      if (iVar6 != 0) {
                                        pxVar2 = ctxt->grammar;
                                        pxVar3 = ctxt->parentgrammar;
                                        ctxt->parentgrammar = pxVar2;
                                        pxVar16 = xmlRelaxNGParseGrammar(ctxt,node->children);
                                        if (pxVar2 != (xmlRelaxNGGrammarPtr_conflict)0x0) {
                                          ctxt->grammar = pxVar2;
                                          ctxt->parentgrammar = pxVar3;
                                        }
                                        if (pxVar16 == (xmlRelaxNGGrammarPtr_conflict)0x0) {
                                          return (xmlRelaxNGDefinePtr_conflict)0x0;
                                        }
                                        return pxVar16->start;
                                      }
                                      pxVar19 = node->ns;
                                    }
                                    if ((pxVar19 != (xmlNs *)0x0) &&
                                       (node->type == XML_ELEMENT_NODE)) {
                                      iVar6 = xmlStrEqual(node->name,"parentRef");
                                      pxVar19 = node->ns;
                                      if (iVar6 != 0) {
                                        iVar6 = xmlStrEqual(pxVar19->href,
                                                            (xmlChar *)
                                                            "http://relaxng.org/ns/structure/1.0");
                                        if (iVar6 != 0) {
                                          if (ctxt->parentgrammar ==
                                              (xmlRelaxNGGrammarPtr_conflict)0x0) {
                                            pcVar18 = "Use of parentRef without a parent grammar\n";
                                            pxVar7 = (xmlRelaxNGDefinePtr_conflict)0x0;
                                            iVar6 = 0x427;
                                            goto LAB_00174255;
                                          }
                                          pxVar7 = xmlRelaxNGNewDefine(ctxt,node);
                                          if (pxVar7 == (xmlRelaxNGDefinePtr_conflict)0x0) {
                                            return (xmlRelaxNGDefinePtr_conflict)0x0;
                                          }
                                          pxVar7->type = XML_RELAXNG_PARENTREF;
                                          pxVar10 = xmlGetProp(node,"name");
                                          pxVar7->name = pxVar10;
                                          if (pxVar10 == (xmlChar *)0x0) {
                                            pcVar18 = "parentRef has no name\n";
                                            iVar6 = 0x426;
                                            pxVar10 = (xmlChar *)0x0;
LAB_00175195:
                                            xmlRngPErr(ctxt,node,iVar6,pcVar18,pxVar10,
                                                       (xmlChar *)0x0);
                                          }
                                          else {
                                            xmlRelaxNGNormExtSpace(pxVar10);
                                            iVar6 = xmlValidateNCName(pxVar7->name,0);
                                            if (iVar6 != 0) {
                                              pxVar10 = pxVar7->name;
                                              pcVar18 = "parentRef name \'%s\' is not an NCName\n";
                                              iVar6 = 0x425;
                                              goto LAB_00175195;
                                            }
                                          }
                                          if (node->children != (_xmlNode *)0x0) {
                                            xmlRngPErr(ctxt,node,0x428,"parentRef is not empty\n",
                                                       (xmlChar *)0x0,(xmlChar *)0x0);
                                          }
                                          pxVar11 = ctxt->parentgrammar->refs;
                                          if (pxVar11 == (xmlHashTablePtr)0x0) {
                                            pxVar11 = xmlHashCreate(10);
                                            ctxt->parentgrammar->refs = pxVar11;
                                            if (pxVar11 == (xmlHashTablePtr)0x0) {
                                              pcVar18 = "Could not create references hash\n";
                                              pxVar7 = (xmlRelaxNGDefinePtr_conflict)0x0;
                                              iVar6 = 0x424;
                                              goto LAB_00174255;
                                            }
                                          }
                                          if (pxVar7->name == (xmlChar *)0x0) {
                                            return pxVar7;
                                          }
                                          iVar6 = xmlHashAddEntry(pxVar11,pxVar7->name,pxVar7);
                                          if (-1 < iVar6) {
                                            return pxVar7;
                                          }
                                          pvVar12 = xmlHashLookup(ctxt->parentgrammar->refs,
                                                                  pxVar7->name);
                                          if (pvVar12 != (void *)0x0) {
LAB_00174831:
                                            pxVar7->nextHash =
                                                 *(xmlRelaxNGDefinePtr *)((long)pvVar12 + 0x58);
                                            *(xmlRelaxNGDefinePtr_conflict *)((long)pvVar12 + 0x58)
                                                 = pxVar7;
                                            return pxVar7;
                                          }
                                          pxVar10 = pxVar7->name;
                                          pcVar18 = "Internal error parentRef definitions \'%s\'\n";
                                          pxVar7 = (xmlRelaxNGDefinePtr_conflict)0x0;
                                          iVar6 = 0x424;
                                          goto LAB_0017514c;
                                        }
                                        pxVar19 = node->ns;
                                      }
                                      if ((((pxVar19 != (xmlNs *)0x0) &&
                                           (node->type == XML_ELEMENT_NODE)) &&
                                          (iVar6 = xmlStrEqual(node->name,(xmlChar *)"mixed"),
                                          iVar6 != 0)) &&
                                         (iVar6 = xmlStrEqual(node->ns->href,
                                                              (xmlChar *)
                                                              "http://relaxng.org/ns/structure/1.0")
                                         , iVar6 != 0)) {
                                        if (node->children != (_xmlNode *)0x0) {
                                          pxVar7 = xmlRelaxNGParseInterleave(ctxt,node);
                                          if (pxVar7 == (xmlRelaxNGDefinePtr_conflict)0x0) {
                                            return (xmlRelaxNGDefinePtr_conflict)0x0;
                                          }
                                          if (((pxVar7->content != (xmlRelaxNGDefinePtr)0x0) &&
                                              (pxVar7->content->next != (xmlRelaxNGDefinePtr)0x0))
                                             && (pxVar8 = xmlRelaxNGNewDefine(ctxt,node),
                                                pxVar8 != (xmlRelaxNGDefinePtr_conflict)0x0)) {
                                            pxVar8->type = XML_RELAXNG_GROUP;
                                            pxVar8->content = pxVar7->content;
                                            pxVar7->content = pxVar8;
                                          }
                                          pxVar9 = xmlRelaxNGNewDefine(ctxt,node);
                                          if (pxVar9 == (xmlRelaxNGDefinePtr_conflict)0x0) {
                                            return pxVar7;
                                          }
                                          pxVar9->type = XML_RELAXNG_TEXT;
                                          pxVar9->next = pxVar7->content;
LAB_00174380:
                                          pxVar7->content = pxVar9;
                                          return pxVar7;
                                        }
                                        pcVar18 = "Mixed is empty\n";
                                        pxVar7 = (xmlRelaxNGDefinePtr_conflict)0x0;
                                        iVar6 = 0x3ff;
                                        goto LAB_00174255;
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      goto LAB_00175133;
    }
    iVar6 = xmlStrEqual(pxVar19->href,(xmlChar *)"http://relaxng.org/ns/structure/1.0");
    if (iVar6 == 0) {
      pxVar19 = node->ns;
      goto LAB_001741c7;
    }
    pxVar7 = xmlRelaxNGNewDefine(ctxt,node);
    if (pxVar7 == (xmlRelaxNGDefinePtr_conflict)0x0) {
      return (xmlRelaxNGDefinePtr_conflict)0x0;
    }
    pxVar7->type = XML_RELAXNG_ATTRIBUTE;
    pxVar7->parent = ctxt->def;
    pxVar22 = node->children;
    if (pxVar22 != (xmlNodePtr)0x0) {
      uVar1 = ctxt->flags;
      ctxt->flags = uVar1 | 1;
      pxVar8 = xmlRelaxNGParseNameClass(ctxt,pxVar22,pxVar7);
      if ((pxVar8 == (xmlRelaxNGDefinePtr_conflict)0x0) ||
         (pxVar22 = pxVar22->next, pxVar22 != (_xmlNode *)0x0)) {
        pxVar8 = xmlRelaxNGParsePattern(ctxt,pxVar22);
        if ((pxVar8 != (xmlRelaxNGDefinePtr_conflict)0x0) &&
           (uVar17 = pxVar8->type + XML_RELAXNG_NOT_ALLOWED, uVar17 < 0x16)) {
          if ((0x1fff76U >> (uVar17 & 0x1f) & 1) == 0) {
            if ((0x200088U >> (uVar17 & 0x1f) & 1) == 0) {
              pcVar18 = "RNG Internal error, noop found in attribute\n";
              iVar6 = 0x3ed;
            }
            else {
              pcVar18 = "attribute has invalid content\n";
              iVar6 = 0x3eb;
            }
            xmlRngPErr(ctxt,node,iVar6,pcVar18,(xmlChar *)0x0,(xmlChar *)0x0);
          }
          else {
            pxVar7->content = pxVar8;
            pxVar8->parent = pxVar7;
          }
        }
        if (pxVar22->next != (_xmlNode *)0x0) {
          xmlRngPErr(ctxt,node,0x3ea,"attribute has multiple children\n",(xmlChar *)0x0,
                     (xmlChar *)0x0);
        }
      }
      ctxt->flags = uVar1;
      return pxVar7;
    }
    pcVar18 = "xmlRelaxNGParseattribute: attribute has no children\n";
    iVar6 = 0x3ec;
LAB_00174255:
    pxVar10 = (xmlChar *)0x0;
  }
LAB_0017514c:
  pxVar13 = (xmlChar *)0x0;
LAB_0017514f:
  xmlRngPErr(ctxt,node,iVar6,pcVar18,pxVar10,pxVar13);
  return pxVar7;
}

Assistant:

static xmlRelaxNGDefinePtr
xmlRelaxNGParsePattern(xmlRelaxNGParserCtxtPtr ctxt, xmlNodePtr node)
{
    xmlRelaxNGDefinePtr def = NULL;

    if (node == NULL) {
        return (NULL);
    }
    if (IS_RELAXNG(node, "element")) {
        def = xmlRelaxNGParseElement(ctxt, node);
    } else if (IS_RELAXNG(node, "attribute")) {
        def = xmlRelaxNGParseAttribute(ctxt, node);
    } else if (IS_RELAXNG(node, "empty")) {
        def = xmlRelaxNGNewDefine(ctxt, node);
        if (def == NULL)
            return (NULL);
        def->type = XML_RELAXNG_EMPTY;
        if (node->children != NULL) {
            xmlRngPErr(ctxt, node, XML_RNGP_EMPTY_NOT_EMPTY,
                       "empty: had a child node\n", NULL, NULL);
        }
    } else if (IS_RELAXNG(node, "text")) {
        def = xmlRelaxNGNewDefine(ctxt, node);
        if (def == NULL)
            return (NULL);
        def->type = XML_RELAXNG_TEXT;
        if (node->children != NULL) {
            xmlRngPErr(ctxt, node, XML_RNGP_TEXT_HAS_CHILD,
                       "text: had a child node\n", NULL, NULL);
        }
    } else if (IS_RELAXNG(node, "zeroOrMore")) {
        def = xmlRelaxNGNewDefine(ctxt, node);
        if (def == NULL)
            return (NULL);
        def->type = XML_RELAXNG_ZEROORMORE;
        if (node->children == NULL) {
            xmlRngPErr(ctxt, node, XML_RNGP_EMPTY_CONSTRUCT,
                       "Element %s is empty\n", node->name, NULL);
        } else {
            def->content =
                xmlRelaxNGParsePatterns(ctxt, node->children, 1);
        }
    } else if (IS_RELAXNG(node, "oneOrMore")) {
        def = xmlRelaxNGNewDefine(ctxt, node);
        if (def == NULL)
            return (NULL);
        def->type = XML_RELAXNG_ONEORMORE;
        if (node->children == NULL) {
            xmlRngPErr(ctxt, node, XML_RNGP_EMPTY_CONSTRUCT,
                       "Element %s is empty\n", node->name, NULL);
        } else {
            def->content =
                xmlRelaxNGParsePatterns(ctxt, node->children, 1);
        }
    } else if (IS_RELAXNG(node, "optional")) {
        def = xmlRelaxNGNewDefine(ctxt, node);
        if (def == NULL)
            return (NULL);
        def->type = XML_RELAXNG_OPTIONAL;
        if (node->children == NULL) {
            xmlRngPErr(ctxt, node, XML_RNGP_EMPTY_CONSTRUCT,
                       "Element %s is empty\n", node->name, NULL);
        } else {
            def->content =
                xmlRelaxNGParsePatterns(ctxt, node->children, 1);
        }
    } else if (IS_RELAXNG(node, "choice")) {
        def = xmlRelaxNGNewDefine(ctxt, node);
        if (def == NULL)
            return (NULL);
        def->type = XML_RELAXNG_CHOICE;
        if (node->children == NULL) {
            xmlRngPErr(ctxt, node, XML_RNGP_EMPTY_CONSTRUCT,
                       "Element %s is empty\n", node->name, NULL);
        } else {
            def->content =
                xmlRelaxNGParsePatterns(ctxt, node->children, 0);
        }
    } else if (IS_RELAXNG(node, "group")) {
        def = xmlRelaxNGNewDefine(ctxt, node);
        if (def == NULL)
            return (NULL);
        def->type = XML_RELAXNG_GROUP;
        if (node->children == NULL) {
            xmlRngPErr(ctxt, node, XML_RNGP_EMPTY_CONSTRUCT,
                       "Element %s is empty\n", node->name, NULL);
        } else {
            def->content =
                xmlRelaxNGParsePatterns(ctxt, node->children, 0);
        }
    } else if (IS_RELAXNG(node, "ref")) {
        def = xmlRelaxNGNewDefine(ctxt, node);
        if (def == NULL)
            return (NULL);
        def->type = XML_RELAXNG_REF;
        def->name = xmlGetProp(node, BAD_CAST "name");
        if (def->name == NULL) {
            xmlRngPErr(ctxt, node, XML_RNGP_REF_NO_NAME, "ref has no name\n",
                       NULL, NULL);
        } else {
            xmlRelaxNGNormExtSpace(def->name);
            if (xmlValidateNCName(def->name, 0)) {
                xmlRngPErr(ctxt, node, XML_RNGP_REF_NAME_INVALID,
                           "ref name '%s' is not an NCName\n", def->name,
                           NULL);
            }
        }
        if (node->children != NULL) {
            xmlRngPErr(ctxt, node, XML_RNGP_REF_NOT_EMPTY, "ref is not empty\n",
                       NULL, NULL);
        }
        if (ctxt->grammar->refs == NULL)
            ctxt->grammar->refs = xmlHashCreate(10);
        if (ctxt->grammar->refs == NULL) {
            xmlRngPErr(ctxt, node, XML_RNGP_REF_CREATE_FAILED,
                       "Could not create references hash\n", NULL, NULL);
            def = NULL;
        } else {
            int tmp;

            tmp = xmlHashAddEntry(ctxt->grammar->refs, def->name, def);
            if (tmp < 0) {
                xmlRelaxNGDefinePtr prev;

                prev = (xmlRelaxNGDefinePtr)
                    xmlHashLookup(ctxt->grammar->refs, def->name);
                if (prev == NULL) {
                    if (def->name != NULL) {
		        xmlRngPErr(ctxt, node, XML_RNGP_REF_CREATE_FAILED,
				   "Error refs definitions '%s'\n",
				   def->name, NULL);
                    } else {
		        xmlRngPErr(ctxt, node, XML_RNGP_REF_CREATE_FAILED,
				   "Error refs definitions\n",
				   NULL, NULL);
                    }
                    def = NULL;
                } else {
                    def->nextHash = prev->nextHash;
                    prev->nextHash = def;
                }
            }
        }
    } else if (IS_RELAXNG(node, "data")) {
        def = xmlRelaxNGParseData(ctxt, node);
    } else if (IS_RELAXNG(node, "value")) {
        def = xmlRelaxNGParseValue(ctxt, node);
    } else if (IS_RELAXNG(node, "list")) {
        def = xmlRelaxNGNewDefine(ctxt, node);
        if (def == NULL)
            return (NULL);
        def->type = XML_RELAXNG_LIST;
        if (node->children == NULL) {
            xmlRngPErr(ctxt, node, XML_RNGP_EMPTY_CONSTRUCT,
                       "Element %s is empty\n", node->name, NULL);
        } else {
            def->content =
                xmlRelaxNGParsePatterns(ctxt, node->children, 0);
        }
    } else if (IS_RELAXNG(node, "interleave")) {
        def = xmlRelaxNGParseInterleave(ctxt, node);
    } else if (IS_RELAXNG(node, "externalRef")) {
        def = xmlRelaxNGProcessExternalRef(ctxt, node);
    } else if (IS_RELAXNG(node, "notAllowed")) {
        def = xmlRelaxNGNewDefine(ctxt, node);
        if (def == NULL)
            return (NULL);
        def->type = XML_RELAXNG_NOT_ALLOWED;
        if (node->children != NULL) {
            xmlRngPErr(ctxt, node, XML_RNGP_NOTALLOWED_NOT_EMPTY,
                       "xmlRelaxNGParse: notAllowed element is not empty\n",
                       NULL, NULL);
        }
    } else if (IS_RELAXNG(node, "grammar")) {
        xmlRelaxNGGrammarPtr grammar, old;
        xmlRelaxNGGrammarPtr oldparent;

#ifdef DEBUG_GRAMMAR
        xmlGenericError(xmlGenericErrorContext,
                        "Found <grammar> pattern\n");
#endif

        oldparent = ctxt->parentgrammar;
        old = ctxt->grammar;
        ctxt->parentgrammar = old;
        grammar = xmlRelaxNGParseGrammar(ctxt, node->children);
        if (old != NULL) {
            ctxt->grammar = old;
            ctxt->parentgrammar = oldparent;
#if 0
            if (grammar != NULL) {
                grammar->next = old->next;
                old->next = grammar;
            }
#endif
        }
        if (grammar != NULL)
            def = grammar->start;
        else
            def = NULL;
    } else if (IS_RELAXNG(node, "parentRef")) {
        if (ctxt->parentgrammar == NULL) {
            xmlRngPErr(ctxt, node, XML_RNGP_PARENTREF_NO_PARENT,
                       "Use of parentRef without a parent grammar\n", NULL,
                       NULL);
            return (NULL);
        }
        def = xmlRelaxNGNewDefine(ctxt, node);
        if (def == NULL)
            return (NULL);
        def->type = XML_RELAXNG_PARENTREF;
        def->name = xmlGetProp(node, BAD_CAST "name");
        if (def->name == NULL) {
            xmlRngPErr(ctxt, node, XML_RNGP_PARENTREF_NO_NAME,
                       "parentRef has no name\n", NULL, NULL);
        } else {
            xmlRelaxNGNormExtSpace(def->name);
            if (xmlValidateNCName(def->name, 0)) {
                xmlRngPErr(ctxt, node, XML_RNGP_PARENTREF_NAME_INVALID,
                           "parentRef name '%s' is not an NCName\n",
                           def->name, NULL);
            }
        }
        if (node->children != NULL) {
            xmlRngPErr(ctxt, node, XML_RNGP_PARENTREF_NOT_EMPTY,
                       "parentRef is not empty\n", NULL, NULL);
        }
        if (ctxt->parentgrammar->refs == NULL)
            ctxt->parentgrammar->refs = xmlHashCreate(10);
        if (ctxt->parentgrammar->refs == NULL) {
            xmlRngPErr(ctxt, node, XML_RNGP_PARENTREF_CREATE_FAILED,
                       "Could not create references hash\n", NULL, NULL);
            def = NULL;
        } else if (def->name != NULL) {
            int tmp;

            tmp =
                xmlHashAddEntry(ctxt->parentgrammar->refs, def->name, def);
            if (tmp < 0) {
                xmlRelaxNGDefinePtr prev;

                prev = (xmlRelaxNGDefinePtr)
                    xmlHashLookup(ctxt->parentgrammar->refs, def->name);
                if (prev == NULL) {
                    xmlRngPErr(ctxt, node, XML_RNGP_PARENTREF_CREATE_FAILED,
                               "Internal error parentRef definitions '%s'\n",
                               def->name, NULL);
                    def = NULL;
                } else {
                    def->nextHash = prev->nextHash;
                    prev->nextHash = def;
                }
            }
        }
    } else if (IS_RELAXNG(node, "mixed")) {
        if (node->children == NULL) {
            xmlRngPErr(ctxt, node, XML_RNGP_EMPTY_CONSTRUCT, "Mixed is empty\n",
                       NULL, NULL);
            def = NULL;
        } else {
            def = xmlRelaxNGParseInterleave(ctxt, node);
            if (def != NULL) {
                xmlRelaxNGDefinePtr tmp;

                if ((def->content != NULL) && (def->content->next != NULL)) {
                    tmp = xmlRelaxNGNewDefine(ctxt, node);
                    if (tmp != NULL) {
                        tmp->type = XML_RELAXNG_GROUP;
                        tmp->content = def->content;
                        def->content = tmp;
                    }
                }

                tmp = xmlRelaxNGNewDefine(ctxt, node);
                if (tmp == NULL)
                    return (def);
                tmp->type = XML_RELAXNG_TEXT;
                tmp->next = def->content;
                def->content = tmp;
            }
        }
    } else {
        xmlRngPErr(ctxt, node, XML_RNGP_UNKNOWN_CONSTRUCT,
                   "Unexpected node %s is not a pattern\n", node->name,
                   NULL);
        def = NULL;
    }
    return (def);
}